

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  undefined1 local_f0 [8];
  CField field;
  
  CField::CField((CField *)local_f0);
  CField::read((CField *)local_f0,in_ESI,__buf,in_RCX);
  CField::solve((CField *)local_f0);
  CField::~CField((CField *)local_f0);
  return 0;
}

Assistant:

int main()
{
    CField field;

    field.read();
    field.solve();

    return 0;
}